

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O3

jobjectArray Java_beagle_BeagleJNIWrapper_getResourceList(JNIEnv *env,jobject obj)

{
  long *plVar1;
  jclass clazz;
  jmethodID methodID;
  jmethodID methodID_00;
  jmethodID methodID_01;
  jmethodID methodID_02;
  jobjectArray p_Var2;
  jobject obj_00;
  jstring p_Var3;
  ulong uVar4;
  char *__s;
  long lVar5;
  
  plVar1 = (long *)beagleGetResourceList();
  if (plVar1 != (long *)0x0) {
    clazz = (*env->functions->FindClass)(env,"beagle/ResourceDetails");
    if (clazz == (jclass)0x0) {
      __s = "NULL returned in FindClass: can\'t find class: beagle/ResourceDetails";
    }
    else {
      methodID = (*env->functions->GetMethodID)(env,clazz,"<init>","(I)V");
      if (methodID == (jmethodID)0x0) {
        __s = 
        "NULL returned in FindClass: can\'t find constructor for class: beagle/ResourceDetails";
      }
      else {
        methodID_00 = (*env->functions->GetMethodID)(env,clazz,"setName","(Ljava/lang/String;)V");
        if (methodID_00 == (jmethodID)0x0) {
          __s = 
          "NULL returned in FindClass: can\'t find \'setName\' method in class: beagle/ResourceDetails"
          ;
        }
        else {
          methodID_01 = (*env->functions->GetMethodID)
                                  (env,clazz,"setDescription","(Ljava/lang/String;)V");
          if (methodID_01 == (jmethodID)0x0) {
            __s = 
            "NULL returned in FindClass: can\'t find \'setDescription\' method in class: beagle/ResourceDetails"
            ;
          }
          else {
            methodID_02 = (*env->functions->GetMethodID)(env,clazz,"setFlags","(J)V");
            if (methodID_02 != (jmethodID)0x0) {
              p_Var2 = (*env->functions->NewObjectArray)(env,(jsize)plVar1[1],clazz,(jobject)0x0);
              if ((int)plVar1[1] < 1) {
                return p_Var2;
              }
              lVar5 = 0;
              uVar4 = 0;
              do {
                obj_00 = JNIEnv_::NewObject(env,clazz,methodID,uVar4 & 0xffffffff);
                p_Var3 = (*env->functions->NewStringUTF)(env,*(char **)(*plVar1 + lVar5));
                JNIEnv_::CallVoidMethod(env,obj_00,methodID_00,p_Var3);
                p_Var3 = (*env->functions->NewStringUTF)(env,*(char **)(*plVar1 + 8 + lVar5));
                JNIEnv_::CallVoidMethod(env,obj_00,methodID_01,p_Var3);
                JNIEnv_::CallVoidMethod
                          (env,obj_00,methodID_02,*(undefined8 *)(*plVar1 + 0x10 + lVar5));
                (*env->functions->SetObjectArrayElement)(env,p_Var2,(jsize)uVar4,obj_00);
                uVar4 = uVar4 + 1;
                lVar5 = lVar5 + 0x20;
              } while ((long)uVar4 < (long)(int)plVar1[1]);
              return p_Var2;
            }
            __s = 
            "NULL returned in FindClass: can\'t find \'setFlags\' method in class: beagle/ResourceDetails"
            ;
          }
        }
      }
    }
    puts(__s);
  }
  return (jobjectArray)0x0;
}

Assistant:

JNIEXPORT jobjectArray JNICALL Java_beagle_BeagleJNIWrapper_getResourceList
  (JNIEnv *env, jobject obj)
{
	BeagleResourceList* rl = beagleGetResourceList();

	if (rl == NULL) {
	    return NULL;
    }

	jclass objClass = env->FindClass("beagle/ResourceDetails");
	if (objClass == NULL) {
		printf("NULL returned in FindClass: can't find class: beagle/ResourceDetails\n");
		return NULL;
	}

	jmethodID constructorMethodID = env->GetMethodID(objClass, "<init>","(I)V");
	if (constructorMethodID == NULL) {
		printf("NULL returned in FindClass: can't find constructor for class: beagle/ResourceDetails\n");
		return NULL;
    }

	jmethodID setNameMethodID = env->GetMethodID(objClass, "setName", "(Ljava/lang/String;)V");
	if (setNameMethodID == NULL) {
		printf("NULL returned in FindClass: can't find 'setName' method in class: beagle/ResourceDetails\n");
		return NULL;
    }

	jmethodID setDescriptionID = env->GetMethodID(objClass, "setDescription", "(Ljava/lang/String;)V");
	if (setDescriptionID == NULL) {
		printf("NULL returned in FindClass: can't find 'setDescription' method in class: beagle/ResourceDetails\n");
		return NULL;
    }

	jmethodID setFlagsMethodID = env->GetMethodID(objClass, "setFlags", "(J)V");
	if (setFlagsMethodID == NULL) {
		printf("NULL returned in FindClass: can't find 'setFlags' method in class: beagle/ResourceDetails\n");
		return NULL;
    }

    jobjectArray resourceArray = env->NewObjectArray(rl->length, objClass, NULL);

	for (int i = 0; i < rl->length; i++) {
	    jobject resourceObj = env->NewObject(objClass, constructorMethodID, i);

	    jstring jString = env->NewStringUTF(rl->list[i].name);
	    env->CallVoidMethod(resourceObj, setNameMethodID, jString);

	    jString = env->NewStringUTF(rl->list[i].description);
    	env->CallVoidMethod(resourceObj, setDescriptionID, jString);

	    env->CallVoidMethod(resourceObj, setFlagsMethodID, rl->list[i].supportFlags);

        env->SetObjectArrayElement(resourceArray, i, resourceObj);
	}

	return resourceArray;
}